

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305.c
# Opt level: O0

void poly1305_process(mbedtls_poly1305_context *ctx,size_t nblocks,uchar *input,
                     uint32_t needs_padding)

{
  uint32_t b;
  uint b_00;
  uint b_01;
  uint b_02;
  uint32_t b_03;
  uint32_t b_04;
  uint32_t b_05;
  uint32_t a;
  uint32_t a_00;
  uint32_t a_01;
  uint32_t a_02;
  uint32_t a_03;
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  uint64_t uVar14;
  uint64_t uVar15;
  uint64_t uVar16;
  uint64_t uVar17;
  uint64_t uVar18;
  uint64_t uVar19;
  uint64_t uVar20;
  ulong uVar21;
  ulong local_88;
  size_t i;
  size_t offset;
  uint32_t rs3;
  uint32_t rs2;
  uint32_t rs1;
  uint32_t r3;
  uint32_t r2;
  uint32_t r1;
  uint32_t r0;
  uint32_t acc4;
  uint32_t acc3;
  uint32_t acc2;
  uint32_t acc1;
  uint32_t acc0;
  uint64_t d3;
  uint64_t d2;
  uint64_t d1;
  uint64_t d0;
  uint32_t needs_padding_local;
  uchar *input_local;
  size_t nblocks_local;
  mbedtls_poly1305_context *ctx_local;
  
  i = 0;
  b = ctx->r[0];
  b_00 = ctx->r[1];
  b_01 = ctx->r[2];
  b_02 = ctx->r[3];
  b_03 = b_00 + (b_00 >> 2);
  b_04 = b_01 + (b_01 >> 2);
  b_05 = b_02 + (b_02 >> 2);
  acc2 = ctx->acc[0];
  acc3 = ctx->acc[1];
  acc4 = ctx->acc[2];
  r0 = ctx->acc[3];
  r1 = ctx->acc[4];
  for (local_88 = 0; local_88 < nblocks; local_88 = local_88 + 1) {
    uVar2 = (ulong)acc2 +
            (ulong)CONCAT13(input[i + 3],CONCAT12(input[i + 2],CONCAT11(input[i + 1],input[i])));
    uVar3 = (ulong)acc3 + (uVar2 >> 0x20) +
            (ulong)CONCAT13(input[i + 7],CONCAT12(input[i + 6],CONCAT11(input[i + 5],input[i + 4])))
    ;
    uVar4 = (ulong)acc4 + (uVar3 >> 0x20) +
            (ulong)CONCAT13(input[i + 0xb],
                            CONCAT12(input[i + 10],CONCAT11(input[i + 9],input[i + 8])));
    lVar5 = (ulong)r0 + (uVar4 >> 0x20) +
            (ulong)CONCAT13(input[i + 0xf],
                            CONCAT12(input[i + 0xe],CONCAT11(input[i + 0xd],input[i + 0xc])));
    a = (uint32_t)uVar2;
    a_00 = (uint32_t)uVar3;
    a_01 = (uint32_t)uVar4;
    a_02 = (uint32_t)lVar5;
    a_03 = (int)((ulong)lVar5 >> 0x20) + needs_padding + r1;
    uVar6 = mul64(a,b);
    uVar7 = mul64(a_00,b_05);
    uVar8 = mul64(a_01,b_04);
    uVar9 = mul64(a_02,b_03);
    uVar2 = uVar6 + uVar7 + uVar8 + uVar9;
    uVar6 = mul64(a,b_00);
    uVar7 = mul64(a_00,b);
    uVar8 = mul64(a_01,b_05);
    uVar9 = mul64(a_02,b_04);
    uVar10 = mul64(a_03,b_03);
    uVar11 = mul64(a,b_01);
    uVar12 = mul64(a_00,b_00);
    uVar13 = mul64(a_01,b);
    uVar14 = mul64(a_02,b_05);
    uVar15 = mul64(a_03,b_04);
    uVar16 = mul64(a,b_02);
    uVar17 = mul64(a_00,b_01);
    uVar18 = mul64(a_01,b_00);
    uVar19 = mul64(a_02,b);
    uVar20 = mul64(a_03,b_05);
    uVar3 = (uVar2 >> 0x20) + uVar6 + uVar7 + uVar8 + uVar9 + uVar10;
    uVar4 = (uVar3 >> 0x20) + uVar11 + uVar12 + uVar13 + uVar14 + uVar15;
    uVar21 = (uVar4 >> 0x20) + uVar16 + uVar17 + uVar18 + uVar19 + uVar20;
    uVar1 = (int)(uVar21 >> 0x20) + b * a_03;
    uVar2 = (uVar2 & 0xffffffff) + (ulong)(uVar1 >> 2) + (ulong)(uVar1 & 0xfffffffc);
    acc2 = (uint32_t)uVar2;
    uVar2 = (uVar3 & 0xffffffff) + (uVar2 >> 0x20);
    acc3 = (uint32_t)uVar2;
    uVar2 = (uVar4 & 0xffffffff) + (uVar2 >> 0x20);
    acc4 = (uint32_t)uVar2;
    lVar5 = (uVar21 & 0xffffffff) + (uVar2 >> 0x20);
    r0 = (uint32_t)lVar5;
    r1 = (uVar1 & 3) + (int)((ulong)lVar5 >> 0x20);
    i = i + 0x10;
  }
  ctx->acc[0] = acc2;
  ctx->acc[1] = acc3;
  ctx->acc[2] = acc4;
  ctx->acc[3] = r0;
  ctx->acc[4] = r1;
  return;
}

Assistant:

static void poly1305_process( mbedtls_poly1305_context *ctx,
                              size_t nblocks,
                              const unsigned char *input,
                              uint32_t needs_padding )
{
    uint64_t d0, d1, d2, d3;
    uint32_t acc0, acc1, acc2, acc3, acc4;
    uint32_t r0, r1, r2, r3;
    uint32_t rs1, rs2, rs3;
    size_t offset  = 0U;
    size_t i;

    r0 = ctx->r[0];
    r1 = ctx->r[1];
    r2 = ctx->r[2];
    r3 = ctx->r[3];

    rs1 = r1 + ( r1 >> 2U );
    rs2 = r2 + ( r2 >> 2U );
    rs3 = r3 + ( r3 >> 2U );

    acc0 = ctx->acc[0];
    acc1 = ctx->acc[1];
    acc2 = ctx->acc[2];
    acc3 = ctx->acc[3];
    acc4 = ctx->acc[4];

    /* Process full blocks */
    for( i = 0U; i < nblocks; i++ )
    {
        /* The input block is treated as a 128-bit little-endian integer */
        d0   = BYTES_TO_U32_LE( input, offset + 0  );
        d1   = BYTES_TO_U32_LE( input, offset + 4  );
        d2   = BYTES_TO_U32_LE( input, offset + 8  );
        d3   = BYTES_TO_U32_LE( input, offset + 12 );

        /* Compute: acc += (padded) block as a 130-bit integer */
        d0  += (uint64_t) acc0;
        d1  += (uint64_t) acc1 + ( d0 >> 32U );
        d2  += (uint64_t) acc2 + ( d1 >> 32U );
        d3  += (uint64_t) acc3 + ( d2 >> 32U );
        acc0 = (uint32_t) d0;
        acc1 = (uint32_t) d1;
        acc2 = (uint32_t) d2;
        acc3 = (uint32_t) d3;
        acc4 += (uint32_t) ( d3 >> 32U ) + needs_padding;

        /* Compute: acc *= r */
        d0 = mul64( acc0, r0  ) +
             mul64( acc1, rs3 ) +
             mul64( acc2, rs2 ) +
             mul64( acc3, rs1 );
        d1 = mul64( acc0, r1  ) +
             mul64( acc1, r0  ) +
             mul64( acc2, rs3 ) +
             mul64( acc3, rs2 ) +
             mul64( acc4, rs1 );
        d2 = mul64( acc0, r2  ) +
             mul64( acc1, r1  ) +
             mul64( acc2, r0  ) +
             mul64( acc3, rs3 ) +
             mul64( acc4, rs2 );
        d3 = mul64( acc0, r3  ) +
             mul64( acc1, r2  ) +
             mul64( acc2, r1  ) +
             mul64( acc3, r0  ) +
             mul64( acc4, rs3 );
        acc4 *= r0;

        /* Compute: acc %= (2^130 - 5) (partial remainder) */
        d1 += ( d0 >> 32 );
        d2 += ( d1 >> 32 );
        d3 += ( d2 >> 32 );
        acc0 = (uint32_t) d0;
        acc1 = (uint32_t) d1;
        acc2 = (uint32_t) d2;
        acc3 = (uint32_t) d3;
        acc4 = (uint32_t) ( d3 >> 32 ) + acc4;

        d0 = (uint64_t) acc0 + ( acc4 >> 2 ) + ( acc4 & 0xFFFFFFFCU );
        acc4 &= 3U;
        acc0 = (uint32_t) d0;
        d0 = (uint64_t) acc1 + ( d0 >> 32U );
        acc1 = (uint32_t) d0;
        d0 = (uint64_t) acc2 + ( d0 >> 32U );
        acc2 = (uint32_t) d0;
        d0 = (uint64_t) acc3 + ( d0 >> 32U );
        acc3 = (uint32_t) d0;
        d0 = (uint64_t) acc4 + ( d0 >> 32U );
        acc4 = (uint32_t) d0;

        offset    += POLY1305_BLOCK_SIZE_BYTES;
    }

    ctx->acc[0] = acc0;
    ctx->acc[1] = acc1;
    ctx->acc[2] = acc2;
    ctx->acc[3] = acc3;
    ctx->acc[4] = acc4;
}